

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_2_5::(anonymous_namespace)::jacobiRotateRight<double,0,2>
               (Matrix33<double> *A,double c,double s)

{
  double dVar1;
  double dVar2;
  long lVar3;
  
  for (lVar3 = 0x10; lVar3 != 0x58; lVar3 = lVar3 + 0x18) {
    dVar1 = *(double *)((long)(A->x + -1) + 8 + lVar3);
    dVar2 = *(double *)((long)A->x[0] + lVar3);
    *(double *)((long)(A->x + -1) + 8 + lVar3) = c * dVar1 - dVar2 * s;
    *(double *)((long)A->x[0] + lVar3) = dVar1 * s + dVar2 * c;
  }
  return;
}

Assistant:

void
jacobiRotateRight (IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
                   const T c,
                   const T s)
{
    for (int i = 0; i < 3; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j] = c * tau1 - s * tau2;
        A[i][k] = s * tau1 + c * tau2;
    }
}